

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicLattice.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::CubicLattice::getLatticeConstant
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,CubicLattice *this)

{
  double *pdVar1;
  Vector3d *__args;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = &(this->super_Lattice).cellLen;
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 == (double *)0x0) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)__return_storage_ptr__,(iterator)0x0,
               (double *)__args);
  }
  else {
    *pdVar1 = (__args->super_Vector<double,_3U>).data_[0];
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = pdVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> CubicLattice::getLatticeConstant() {
    std::vector<RealType> lc;

    lc.push_back(cellLen.x());
    return lc;
  }